

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O3

bool __thiscall doublechecked::Roaring::operator==(Roaring *this,Roaring *r)

{
  _Bool _Var1;
  bool bVar2;
  
  _Var1 = roaring_bitmap_equals((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  if ((this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (r->check)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar2 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>>
                      ((this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<unsigned_int>)
                       &(this->check)._M_t._M_impl.super__Rb_tree_header,
                       (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar2 = false;
  }
  _assert_true((ulong)(byte)(_Var1 ^ bVar2 ^ 1),"ans == (check == r.check)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,0x15e);
  return _Var1;
}

Assistant:

bool operator==(const Roaring &r) const {
        bool ans = (plain == r.plain);
        assert_true(ans == (check == r.check));
        return ans;
    }